

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::getIis(Highs *this,HighsIis *iis)

{
  HighsStatus HVar1;
  undefined8 uVar2;
  undefined1 *in_RSI;
  long in_RDI;
  HighsStatus return_status;
  Highs *in_stack_000007d8;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  HighsStatus HVar3;
  HighsIis *in_stack_ffffffffffffff00;
  HighsIis *this_00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  allocator<char> local_d1;
  string local_d0 [16];
  string *in_stack_ffffffffffffff40;
  HighsStatus in_stack_ffffffffffffff48;
  HighsStatus in_stack_ffffffffffffff4c;
  HighsLogOptions *in_stack_ffffffffffffff50;
  string local_40 [36];
  HighsStatus local_1c;
  undefined1 *local_18;
  HighsStatus local_4;
  
  if ((*(int *)(in_RDI + 0x1244) == 7) || (*(int *)(in_RDI + 0x1244) == 10)) {
    local_18 = in_RSI;
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,
                 "Calling Highs::getIis for a model that is known to be feasible\n");
    HighsIis::invalidate(in_stack_ffffffffffffff00);
    *local_18 = 1;
    local_4 = kOk;
  }
  else {
    local_1c = 0;
    if ((*(int *)(in_RDI + 0x1244) != 0) && (*(int *)(in_RDI + 0x1244) != 8)) {
      local_1c = 1;
      modelStatusToString_abi_cxx11_
                ((Highs *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (HighsModelStatus)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      uVar2 = std::__cxx11::string::c_str();
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kWarning,
                   "Calling Highs::getIis for a model with status %s\n",uVar2);
      std::__cxx11::string::~string(local_40);
    }
    HighsLogOptions::HighsLogOptions
              ((HighsLogOptions *)in_stack_ffffffffffffff00,
               (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    getIisInterface(in_stack_000007d8);
    this_00 = (HighsIis *)&local_d1;
    HVar3 = local_1c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"getIisInterface",(allocator *)this_00);
    HVar1 = interpretCallStatus(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    local_1c = HVar1;
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
    HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x48f376);
    HighsIis::operator=(this_00,(HighsIis *)CONCAT44(HVar3,HVar1));
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getIis(HighsIis& iis) {
  if (this->model_status_ == HighsModelStatus::kOptimal ||
      this->model_status_ == HighsModelStatus::kUnbounded) {
    // Strange to call getIis for a model that's known to be feasible
    highsLogUser(
        options_.log_options, HighsLogType::kInfo,
        "Calling Highs::getIis for a model that is known to be feasible\n");
    iis.invalidate();
    // No IIS exists, so validate the empty HighsIis instance
    iis.valid_ = true;
    return HighsStatus::kOk;
  }
  HighsStatus return_status = HighsStatus::kOk;
  if (this->model_status_ != HighsModelStatus::kNotset &&
      this->model_status_ != HighsModelStatus::kInfeasible) {
    return_status = HighsStatus::kWarning;
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "Calling Highs::getIis for a model with status %s\n",
                 this->modelStatusToString(this->model_status_).c_str());
  }
  return_status =
      interpretCallStatus(options_.log_options, this->getIisInterface(),
                          return_status, "getIisInterface");
  iis = this->iis_;
  return return_status;
}